

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmyblas2.c
# Opt level: O1

void zlsolve(int ldm,int ncol,doublecomplex *M,doublecomplex *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  ulong uVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  double *pdVar15;
  double *pdVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  uVar6 = 0;
  if (3 < ncol) {
    lVar12 = (long)ldm;
    lVar11 = (long)(ldm * 4 + 4);
    pdVar7 = &rhs[4].i;
    pdVar15 = &M[lVar12 + 4].i;
    pdVar16 = &M[lVar12 * 2 + 4].i;
    pdVar8 = &M[lVar12 * 3 + 4].i;
    uVar14 = 4;
    uVar6 = 0;
    do {
      dVar1 = rhs[uVar6].r;
      dVar2 = rhs[uVar6].i;
      dVar19 = rhs[uVar6 + 1].r - (dVar1 * M[1].r - M[1].i * dVar2);
      dVar17 = rhs[uVar6 + 1].i - (M[1].r * dVar2 + M[1].i * dVar1);
      dVar20 = (rhs[uVar6 + 2].r - (dVar1 * M[2].r - M[2].i * dVar2)) -
               (dVar19 * M[lVar12 + 2].r - M[lVar12 + 2].i * dVar17);
      dVar18 = (rhs[uVar6 + 2].i - (M[2].r * dVar2 + M[2].i * dVar1)) -
               (M[lVar12 + 2].r * dVar17 + M[lVar12 + 2].i * dVar19);
      dVar21 = ((rhs[uVar6 + 3].r - (dVar1 * M[3].r - M[3].i * dVar2)) -
               (dVar19 * M[lVar12 + 3].r - M[lVar12 + 3].i * dVar17)) -
               (dVar20 * M[lVar12 * 2 + 3].r - M[lVar12 * 2 + 3].i * dVar18);
      dVar22 = ((rhs[uVar6 + 3].i - (M[3].r * dVar2 + M[3].i * dVar1)) -
               (M[lVar12 + 3].r * dVar17 + M[lVar12 + 3].i * dVar19)) -
               (M[lVar12 * 2 + 3].r * dVar18 + M[lVar12 * 2 + 3].i * dVar20);
      rhs[uVar6 + 1].r = dVar19;
      rhs[uVar6 + 1].i = dVar17;
      rhs[uVar6 + 2].r = dVar20;
      rhs[uVar6 + 2].i = dVar18;
      rhs[uVar6 + 3].r = dVar21;
      rhs[uVar6 + 3].i = dVar22;
      uVar6 = uVar6 + 4;
      if (uVar6 < (uint)ncol) {
        lVar9 = 0;
        uVar13 = (ulong)(uint)ncol;
        do {
          dVar3 = *(double *)((long)&M[4].r + lVar9);
          dVar4 = *(double *)((long)&M[4].i + lVar9);
          dVar23 = *(double *)((long)pdVar7 + lVar9 + -8) - (dVar1 * dVar3 + dVar4 * -dVar2);
          dVar24 = *(double *)((long)pdVar7 + lVar9) - (dVar3 * dVar2 + dVar4 * dVar1);
          *(double *)((long)pdVar7 + lVar9 + -8) = dVar23;
          *(double *)((long)pdVar7 + lVar9) = dVar24;
          dVar3 = *(double *)((long)pdVar15 + lVar9 + -8);
          dVar4 = *(double *)((long)pdVar15 + lVar9);
          dVar23 = dVar23 - (dVar19 * dVar3 + dVar4 * -dVar17);
          *(double *)((long)pdVar7 + lVar9 + -8) = dVar23;
          dVar24 = dVar24 - (dVar3 * dVar17 + dVar4 * dVar19);
          *(double *)((long)pdVar7 + lVar9) = dVar24;
          dVar3 = *(double *)((long)pdVar16 + lVar9 + -8);
          dVar4 = *(double *)((long)pdVar16 + lVar9);
          dVar23 = dVar23 - (dVar20 * dVar3 + dVar4 * -dVar18);
          *(double *)((long)pdVar7 + lVar9 + -8) = dVar23;
          dVar24 = dVar24 - (dVar3 * dVar18 + dVar4 * dVar20);
          *(double *)((long)pdVar7 + lVar9) = dVar24;
          dVar3 = *(double *)((long)pdVar8 + lVar9 + -8);
          dVar4 = *(double *)((long)pdVar8 + lVar9);
          *(double *)((long)pdVar7 + lVar9 + -8) = dVar23 - (dVar21 * dVar3 + dVar4 * -dVar22);
          *(double *)((long)pdVar7 + lVar9) = dVar24 - (dVar3 * dVar22 + dVar4 * dVar21);
          lVar9 = lVar9 + 0x10;
          uVar13 = uVar13 - 1;
        } while (uVar14 != uVar13);
      }
      M = M + lVar11;
      uVar14 = uVar14 + 4;
      pdVar7 = pdVar7 + 8;
      pdVar15 = pdVar15 + lVar11 * 2;
      pdVar16 = pdVar16 + lVar11 * 2;
      pdVar8 = pdVar8 + lVar11 * 2;
    } while ((long)uVar6 < (long)(ncol + -3));
  }
  uVar5 = (uint)uVar6;
  if ((int)uVar5 < ncol + -1) {
    uVar6 = uVar6 & 0xffffffff;
    dVar1 = rhs[uVar6].r;
    dVar2 = rhs[uVar6].i;
    uVar10 = uVar5 | 1;
    dVar17 = rhs[uVar10].r - (dVar1 * M[1].r - M[1].i * dVar2);
    dVar18 = rhs[uVar10].i - (M[1].r * dVar2 + M[1].i * dVar1);
    rhs[uVar10].r = dVar17;
    rhs[uVar10].i = dVar18;
    if ((int)(uVar5 | 2) < ncol) {
      pdVar7 = &rhs[uVar6 + 2].i;
      lVar11 = ((uint)ncol - uVar6) + -2;
      pdVar8 = &M[2].i;
      do {
        dVar21 = ((doublecomplex *)(pdVar7 + -1))->r -
                 (dVar1 * ((doublecomplex *)(pdVar8 + -1))->r + *pdVar8 * -dVar2);
        dVar22 = *pdVar7 - (((doublecomplex *)(pdVar8 + -1))->r * dVar2 + *pdVar8 * dVar1);
        ((doublecomplex *)(pdVar7 + -1))->r = dVar21;
        *pdVar7 = dVar22;
        dVar19 = pdVar8[(long)ldm * 2 + -1];
        dVar20 = pdVar8[(long)ldm * 2];
        ((doublecomplex *)(pdVar7 + -1))->r = dVar21 - (dVar17 * dVar19 + dVar20 * -dVar18);
        *pdVar7 = dVar22 - (dVar19 * dVar18 + dVar20 * dVar17);
        pdVar7 = pdVar7 + 2;
        pdVar8 = pdVar8 + 2;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
  }
  return;
}

Assistant:

void zlsolve ( int ldm, int ncol, doublecomplex *M, doublecomplex *rhs )
{
    int k;
    doublecomplex x0, x1, x2, x3, temp;
    doublecomplex *M0;
    doublecomplex *Mki0, *Mki1, *Mki2, *Mki3;
    register int firstcol = 0;

    M0 = &M[0];


    while ( firstcol < ncol - 3 ) { /* Do 4 columns */
      	Mki0 = M0 + 1;
      	Mki1 = Mki0 + ldm + 1;
      	Mki2 = Mki1 + ldm + 1;
      	Mki3 = Mki2 + ldm + 1;

      	x0 = rhs[firstcol];
      	zz_mult(&temp, &x0, Mki0); Mki0++;
      	z_sub(&x1, &rhs[firstcol+1], &temp);
      	zz_mult(&temp, &x0, Mki0); Mki0++;
	z_sub(&x2, &rhs[firstcol+2], &temp);
	zz_mult(&temp, &x1, Mki1); Mki1++;
	z_sub(&x2, &x2, &temp);
      	zz_mult(&temp, &x0, Mki0); Mki0++;
	z_sub(&x3, &rhs[firstcol+3], &temp);
	zz_mult(&temp, &x1, Mki1); Mki1++;
	z_sub(&x3, &x3, &temp);
	zz_mult(&temp, &x2, Mki2); Mki2++;
	z_sub(&x3, &x3, &temp);

 	rhs[++firstcol] = x1;
      	rhs[++firstcol] = x2;
      	rhs[++firstcol] = x3;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    zz_mult(&temp, &x0, Mki0); Mki0++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x1, Mki1); Mki1++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x2, Mki2); Mki2++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x3, Mki3); Mki3++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	}

        M0 += 4 * ldm + 4;
    }

    if ( firstcol < ncol - 1 ) { /* Do 2 columns */
        Mki0 = M0 + 1;
        Mki1 = Mki0 + ldm + 1;

        x0 = rhs[firstcol];
	zz_mult(&temp, &x0, Mki0); Mki0++;
	z_sub(&x1, &rhs[firstcol+1], &temp);

      	rhs[++firstcol] = x1;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    zz_mult(&temp, &x0, Mki0); Mki0++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	    zz_mult(&temp, &x1, Mki1); Mki1++;
	    z_sub(&rhs[k], &rhs[k], &temp);
	} 
    }
    
}